

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

int Gia_ManFactorSop(Gia_Man_t *p,Vec_Int_t *vCiObjIds,Vec_Str_t *vSop,int fHash)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pSop;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_3c;
  int Result;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pMan;
  int fHash_local;
  Vec_Str_t *vSop_local;
  Vec_Int_t *vCiObjIds_local;
  Gia_Man_t *p_local;
  
  pSop = Vec_StrArray(vSop);
  p_00 = Abc_SopSynthesizeOne(pSop,1);
  iVar1 = Gia_ManPiNum(p_00);
  iVar2 = Vec_IntSize(vCiObjIds);
  if (iVar1 != iVar2) {
    __assert_fail("Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                  ,0x42b,"int Gia_ManFactorSop(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *, int)");
  }
  pGVar4 = Gia_ManConst0(p_00);
  pGVar4->Value = 0;
  local_3c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p_00);
    bVar5 = false;
    if (local_3c < iVar1) {
      _Result = Gia_ManCi(p_00,local_3c);
      bVar5 = _Result != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(vCiObjIds,local_3c);
    uVar3 = Abc_Var2Lit(iVar1,0);
    _Result->Value = uVar3;
    local_3c = local_3c + 1;
  }
  local_3c = 0;
  while( true ) {
    bVar5 = false;
    if (local_3c < p_00->nObjs) {
      _Result = Gia_ManObj(p_00,local_3c);
      bVar5 = _Result != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_Result);
    if (iVar1 != 0) {
      if (fHash == 0) {
        iVar1 = Gia_ObjFanin0Copy(_Result);
        iVar2 = Gia_ObjFanin1Copy(_Result);
        uVar3 = Gia_ManAppendAnd(p,iVar1,iVar2);
        _Result->Value = uVar3;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(_Result);
        iVar2 = Gia_ObjFanin1Copy(_Result);
        uVar3 = Gia_ManHashAnd(p,iVar1,iVar2);
        _Result->Value = uVar3;
      }
    }
    local_3c = local_3c + 1;
  }
  pGVar4 = Gia_ManPo(p_00,0);
  iVar1 = Gia_ObjFanin0Copy(pGVar4);
  Gia_ManStop(p_00);
  return iVar1;
}

Assistant:

int Gia_ManFactorSop( Gia_Man_t * p, Vec_Int_t * vCiObjIds, Vec_Str_t * vSop, int fHash )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );
    Gia_Man_t * pMan = Abc_SopSynthesizeOne( Vec_StrArray(vSop), 1 );
    Gia_Obj_t * pObj; int i, Result;
    assert( Gia_ManPiNum(pMan) == Vec_IntSize(vCiObjIds) );
    Gia_ManConst0(pMan)->Value = 0;
    Gia_ManForEachPi( pMan, pObj, i )
        pObj->Value = Abc_Var2Lit( Vec_IntEntry(vCiObjIds, i), 0 );
    Gia_ManForEachAnd( pMan, pObj, i )
        if ( fHash )
            pObj->Value = Gia_ManHashAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( p, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    pObj = Gia_ManPo(pMan, 0);
    Result = Gia_ObjFanin0Copy(pObj);
    Gia_ManStop( pMan );
    return Result;
}